

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiclass.cc
# Opt level: O0

void MULTICLASS::print_score(vw *all,example *ec,uint32_t prediction)

{
  uint in_EDX;
  long in_RSI;
  char label_str [512];
  char temp_str [10];
  allocator local_281;
  string local_280 [55];
  allocator local_249;
  string local_248 [32];
  char local_228 [24];
  float in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  size_t in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  string *in_stack_fffffffffffffe08;
  size_t in_stack_fffffffffffffe10;
  undefined1 in_stack_fffffffffffffe1f;
  shared_data *in_stack_fffffffffffffe20;
  char local_1e [14];
  long local_10;
  
  local_10 = in_RSI;
  snprintf(local_1e,10,"%d",(ulong)in_EDX);
  snprintf(local_228,0x200,"%u",(ulong)*(uint *)(local_10 + 0x6828));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_248,local_228,&local_249);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_280,local_1e,&local_281);
  shared_data::print_update
            (in_stack_fffffffffffffe20,(bool)in_stack_fffffffffffffe1f,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (bool)in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  std::__cxx11::string::~string(local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  return;
}

Assistant:

void print_score(vw& all, example& ec, uint32_t prediction)
{
  char temp_str[10];
  sprintf_s(temp_str, 10, "%d", prediction);

  char label_str[512];
  sprintf_s(label_str, 512, "%u", ec.l.multi.label);

  all.sd->print_update(
      all.holdout_set_off, all.current_pass, label_str, temp_str, ec.num_features, all.progress_add, all.progress_arg);
}